

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmexec.h
# Opt level: O3

double VMExec_Unchecked::DoFLOP(int flop,double v)

{
  double dVar1;
  
  switch(flop) {
  case 0:
    return ABS(v);
  case 1:
    return -v;
  case 2:
    dVar1 = c_exp(v);
    return dVar1;
  case 3:
    dVar1 = c_log(v);
    return dVar1;
  case 4:
    dVar1 = c_log10(v);
    return dVar1;
  case 5:
    dVar1 = c_sqrt(v);
    return dVar1;
  case 6:
    dVar1 = ceil(v);
    return dVar1;
  case 7:
    dVar1 = floor(v);
    return dVar1;
  case 8:
    dVar1 = c_acos(v);
    return dVar1;
  case 9:
    dVar1 = c_asin(v);
    return dVar1;
  case 10:
    dVar1 = c_atan(v);
    return dVar1;
  case 0xb:
    dVar1 = v * 683565275.5764316;
    goto LAB_006c6d22;
  case 0xc:
    dVar1 = v * 683565275.5764316;
    goto LAB_006c6d5c;
  case 0xe:
    dVar1 = c_acos(v);
    break;
  case 0xf:
    dVar1 = c_asin(v);
    break;
  case 0x10:
    dVar1 = c_atan(v);
    break;
  case 0x11:
    dVar1 = v * 11930464.711111112;
LAB_006c6d22:
    dVar1 = FFastTrig::cos(&fasttrig,dVar1 + 6755399441055744.0);
    return dVar1;
  case 0x12:
    dVar1 = v * 11930464.711111112;
LAB_006c6d5c:
    dVar1 = FFastTrig::sin(&fasttrig,dVar1 + 6755399441055744.0);
    return dVar1;
  case 0x13:
    v = v * 0.017453292519943295;
  case 0xd:
    dVar1 = c_tan(v);
    return dVar1;
  case 0x14:
    dVar1 = c_cosh(v);
    return dVar1;
  case 0x15:
    dVar1 = c_sinh(v);
    return dVar1;
  case 0x16:
    dVar1 = c_tanh(v);
    return dVar1;
  default:
    return 0.0;
  }
  return dVar1 * 57.29577951308232;
}

Assistant:

static double DoFLOP(int flop, double v)
{
	switch(flop)
	{
	case FLOP_ABS:		return fabs(v);
	case FLOP_NEG:		return -v;
	case FLOP_EXP:		return g_exp(v);
	case FLOP_LOG:		return g_log(v);
	case FLOP_LOG10:	return g_log10(v);
	case FLOP_SQRT:		return g_sqrt(v);
	case FLOP_CEIL:		return ceil(v);
	case FLOP_FLOOR:	return floor(v);

	case FLOP_ACOS:		return g_acos(v);
	case FLOP_ASIN:		return g_asin(v);
	case FLOP_ATAN:		return g_atan(v);
	case FLOP_COS:		return g_cos(v);
	case FLOP_SIN:		return g_sin(v);
	case FLOP_TAN:		return g_tan(v);

	case FLOP_ACOS_DEG:	return g_acos(v) * (180 / M_PI);
	case FLOP_ASIN_DEG:	return g_asin(v) * (180 / M_PI);
	case FLOP_ATAN_DEG:	return g_atan(v) * (180 / M_PI);
	case FLOP_COS_DEG:	return g_cosdeg(v);
	case FLOP_SIN_DEG:	return g_sindeg(v);
	case FLOP_TAN_DEG:	return g_tan(v * (M_PI / 180));

	case FLOP_COSH:		return g_cosh(v);
	case FLOP_SINH:		return g_sinh(v);
	case FLOP_TANH:		return g_tanh(v);
	}
	assert(0);
	return 0;
}